

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int ncnn_extractor_extract(ncnn_extractor_t ex,char *name,ncnn_mat_t *mat)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDX;
  int ret;
  Mat mat0;
  Mat *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Extractor *in_stack_ffffffffffffffa8;
  
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffffa0);
  iVar1 = ncnn::Extractor::extract
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff94);
  pvVar2 = operator_new(0x48);
  ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
  *in_RDX = pvVar2;
  ncnn::Mat::~Mat((Mat *)0x147a8c);
  return iVar1;
}

Assistant:

int ncnn_extractor_extract(ncnn_extractor_t ex, const char* name, ncnn_mat_t* mat)
{
    Mat mat0;
    int ret = ((Extractor*)ex)->extract(name, mat0);
    *mat = (ncnn_mat_t)(new Mat(mat0));
    return ret;
}